

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode cf_h2_keep_alive(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 uVar1;
  CURLcode CVar2;
  cf_call_data save;
  CURLcode result;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x10);
  *(Curl_easy **)((long)cf->ctx + 0x10) = data;
  CVar2 = http2_send_ping(cf,data);
  *(undefined8 *)((long)cf->ctx + 0x10) = uVar1;
  return CVar2;
}

Assistant:

static CURLcode cf_h2_keep_alive(struct Curl_cfilter *cf,
                                 struct Curl_easy *data)
{
  CURLcode result;
  struct cf_call_data save;

  CF_DATA_SAVE(save, cf, data);
  result = http2_send_ping(cf, data);
  CF_DATA_RESTORE(cf, save);
  return result;
}